

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O1

void __thiscall xmrig::DaemonClient::onHttpData(DaemonClient *this,HttpData *data)

{
  uint64_t *this_00;
  bool bVar1;
  int iVar2;
  EVP_PKEY_CTX *pEVar3;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar4;
  uint64_t uVar5;
  int64_t id;
  Value *result;
  Value *error;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  char *pcVar6;
  Document doc;
  Data local_90;
  Data local_80;
  undefined1 local_70 [64];
  uint local_30;
  
  if (data->status != 200) {
    retry(this);
    return;
  }
  this_00 = &data[-1].m_id;
  HttpContext::ip_abi_cxx11_((string *)&local_80.s,(HttpContext *)this_00);
  String::copy(&(this->super_BaseClient).m_ip,
               (EVP_PKEY_CTX *)CONCAT44(local_80.s.hashcode,local_80.s.length),src);
  if ((undefined1 *)CONCAT44(local_80.s.hashcode,local_80.s.length) != local_70) {
    operator_delete((undefined1 *)CONCAT44(local_80.s.hashcode,local_80.s.length));
  }
  iVar2 = (*(this->super_BaseClient).super_IClient._vptr_IClient[5])(this);
  if ((char)iVar2 != '\0') {
    pEVar3 = (EVP_PKEY_CTX *)HttpsClient::version((HttpsClient *)this_00);
    String::copy(&this->m_tlsVersion,pEVar3,src_00);
    pEVar3 = (EVP_PKEY_CTX *)HttpsClient::fingerprint((HttpsClient *)this_00);
    String::copy(&this->m_tlsFingerprint,pEVar3,src_01);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_80.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  local_90.n = (Number)(data->body)._M_dataplus._M_p;
  local_90.s.str = (Ch *)local_90.n;
  pGVar4 = rapidjson::
           GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           ::
           ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                     ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                       *)&local_80.s,(GenericStringStream<rapidjson::UTF8<char>_> *)&local_90.s);
  if ((pGVar4->parseResult_).code_ == kParseErrorNone) {
    if (data->method == 1) {
      iVar2 = std::__cxx11::string::compare((char *)&data->url);
      if (iVar2 == 0) {
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_90.s,(Ch *)&local_80);
        if (local_90.n.i64 ==
            (Number)((ulong)local_80.s.length * 0x20 + ((ulong)local_80.s.str & 0xffffffffffff))) {
          this->m_monero = false;
          send(this,1,"/getinfo",0,0);
          goto LAB_00156eeb;
        }
        uVar5 = Json::getUint64((Value *)&local_80.s,"height",0);
        pcVar6 = Json::getString((Value *)&local_80.s,"hash",(char *)0x0);
        if ((this->super_BaseClient).m_job.m_height == uVar5) {
          bVar1 = String::isEqual(&this->m_prevHash,pcVar6);
          goto LAB_00156f79;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&data->url);
        if (iVar2 != 0) goto LAB_00156eeb;
        uVar5 = Json::getUint64((Value *)&local_80.s,"height",0);
        pcVar6 = Json::getString((Value *)&local_80.s,"top_block_hash",(char *)0x0);
        if ((this->super_BaseClient).m_job.m_height == uVar5) {
          bVar1 = String::isEqual(&this->m_prevHash,pcVar6);
LAB_00156f79:
          if (bVar1 != false) goto LAB_00156eeb;
        }
      }
      getBlockTemplate(this);
      goto LAB_00156eeb;
    }
    id = Json::getInt64((Value *)&local_80.s,"id",-1);
    result = Json::getObject((Value *)&local_80.s,"result");
    error = Json::getObject((Value *)&local_80.s,"error");
    bVar1 = parseResponse(this,id,result,error);
    if (bVar1) goto LAB_00156eeb;
  }
  else if (((this->super_BaseClient).m_quiet == false) &&
          ((this->super_BaseClient).m_failures < (long)(this->super_BaseClient).m_retries)) {
    if ((ulong)local_30 < 0x12) {
      pcVar6 = &DAT_0018d69c + *(int *)(&DAT_0018d69c + (ulong)local_30 * 4);
    }
    else {
      pcVar6 = "Unknown error.";
    }
    Log::print(ERR,"[%s:%d] JSON decode failed: \"%s\"",
               (this->super_BaseClient).m_pool.m_url.m_host.m_data,
               (ulong)(this->super_BaseClient).m_pool.m_url.m_port,pcVar6);
  }
  retry(this);
LAB_00156eeb:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_80.s);
  return;
}

Assistant:

void xmrig::DaemonClient::onHttpData(const HttpData &data)
{
    if (data.status != HTTP_STATUS_OK) {
        return retry();
    }

    LOG_DEBUG("[%s:%d] received (%d bytes): \"%.*s\"", m_pool.host().data(), m_pool.port(), static_cast<int>(data.body.size()), static_cast<int>(data.body.size()), data.body.c_str());

    m_ip = static_cast<const HttpContext &>(data).ip().c_str();

#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        m_tlsVersion     = static_cast<const HttpsClient &>(data).version();
        m_tlsFingerprint = static_cast<const HttpsClient &>(data).fingerprint();
    }
#   endif

    rapidjson::Document doc;
    if (doc.Parse(data.body.c_str()).HasParseError()) {
        if (!isQuiet()) {
            LOG_ERR("[%s:%d] JSON decode failed: \"%s\"", m_pool.host().data(), m_pool.port(), rapidjson::GetParseError_En(doc.GetParseError()));
        }

        return retry();
    }

    if (data.method == HTTP_GET) {
        if (data.url == kGetHeight) {
            if (!doc.HasMember(kHash)) {
                m_monero = false;

                return send(HTTP_GET, kGetInfo);
            }

            if (isOutdated(Json::getUint64(doc, kHeight), Json::getString(doc, kHash))) {
                getBlockTemplate();
            }
        }
        else if (data.url == kGetInfo && isOutdated(Json::getUint64(doc, kHeight), Json::getString(doc, "top_block_hash"))) {
            getBlockTemplate();
        }

        return;
    }

    if (!parseResponse(Json::getInt64(doc, "id", -1), Json::getObject(doc, "result"), Json::getObject(doc, "error"))) {
        retry();
    }
}